

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O1

size_t snappy::Compress(char *input,size_t input_length,string *compressed)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  pointer compressed_00;
  size_t compressed_length;
  size_t local_30;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = input_length;
  auVar2._8_8_ = 4;
  auVar2._0_8_ = 0xaaaaaaaaaaaaaaab;
  compressed_00 = (char *)0x0;
  std::__cxx11::string::resize((ulong)compressed,(char)(SUB168(auVar1 * auVar2,8) >> 2) + ' ');
  if (compressed->_M_string_length != 0) {
    compressed_00 = (compressed->_M_dataplus)._M_p;
  }
  RawCompress(input,input_length,compressed_00,&local_30);
  std::__cxx11::string::resize((ulong)compressed,(char)local_30);
  return local_30;
}

Assistant:

size_t Compress(const char* input, size_t input_length, string* compressed) {
  // Pre-grow the buffer to the max length of the compressed output
  compressed->resize(MaxCompressedLength(input_length));

  size_t compressed_length;
  RawCompress(input, input_length, string_as_array(compressed),
              &compressed_length);
  compressed->resize(compressed_length);
  return compressed_length;
}